

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

string_view __thiscall slang::ast::DefinitionSymbol::getKindString(DefinitionSymbol *this)

{
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  
  if (this->definitionKind == Module) {
    sVar2._M_str = "module";
    sVar2._M_len = 6;
    return sVar2;
  }
  if (this->definitionKind == Program) {
    sVar1._M_str = "program";
    sVar1._M_len = 7;
    return sVar1;
  }
  sVar3._M_str = "interface";
  sVar3._M_len = 9;
  return sVar3;
}

Assistant:

std::string_view DefinitionSymbol::getKindString() const {
    switch (definitionKind) {
        case DefinitionKind::Module:
            return "module"sv;
        case DefinitionKind::Interface:
            return "interface"sv;
        case DefinitionKind::Program:
            return "program"sv;
    }
    SLANG_UNREACHABLE;
}